

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool Catch::list(IStreamingReporter *reporter,Config *config)

{
  bool bVar1;
  undefined1 local_19;
  bool listed;
  Config *config_local;
  IStreamingReporter *reporter_local;
  
  local_19 = Config::listTests(config);
  if (local_19) {
    anon_unknown_23::listTests(reporter,&config->super_IConfig);
  }
  bVar1 = Config::listTags(config);
  if (bVar1) {
    local_19 = true;
    anon_unknown_23::listTags(reporter,&config->super_IConfig);
  }
  bVar1 = Config::listReporters(config);
  if (bVar1) {
    local_19 = true;
    anon_unknown_23::listReporters(reporter,&config->super_IConfig);
  }
  return local_19;
}

Assistant:

bool list(IStreamingReporter &reporter, Config const &config) {
        bool listed = false;
        if (config.listTests()) {
            listed = true;
            listTests(reporter, config);
        }
        if (config.listTags()) {
            listed = true;
            listTags(reporter, config);
        }
        if (config.listReporters()) {
            listed = true;
            listReporters(reporter, config);
        }
        return listed;
    }